

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_set_inclusion_recursion(archive *_a,wchar_t enabled)

{
  int iVar1;
  wchar_t magic_test;
  archive_match *a;
  wchar_t enabled_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_set_inclusion_recursion");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    _a[1].state = enabled;
    _a_local._4_4_ = L'\0';
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_set_inclusion_recursion(struct archive *_a, int enabled)
{
	struct archive_match *a;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_set_inclusion_recursion");
	a = (struct archive_match *)_a;
	a->recursive_include = enabled;
	return (ARCHIVE_OK);
}